

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  seqDef *psVar1;
  ZSTD_compressedBlockState_t *pZVar2;
  seqStore_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  ZSTD_CCtx *in_RDI;
  U32 rawOffset;
  repcodes_t updatedRepcodes;
  size_t i;
  ZSTD_Sequence *outSeqs;
  size_t lastLLSize;
  size_t literalsRead;
  size_t seqStoreLiteralsSize;
  size_t seqStoreSeqSize;
  seqDef *seqStoreSeqs;
  seqStore_t *seqStore;
  uint local_58;
  undefined8 local_54;
  U32 local_4c;
  ulong uVar6;
  ZSTD_Sequence *rep;
  ulong local_30;
  
  psVar3 = ZSTD_getSeqStore(in_RDI);
  psVar1 = psVar3->sequencesStart;
  uVar4 = (long)psVar3->sequences - (long)psVar1 >> 3;
  uVar5 = (long)psVar3->lit - (long)psVar3->litStart;
  local_30 = 0;
  rep = (in_RDI->seqCollector).seqStart + (in_RDI->seqCollector).seqIndex;
  if ((in_RDI->seqCollector).maxSequences <= (in_RDI->seqCollector).seqIndex + 1) {
    __assert_fail("zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5db1,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  if ((in_RDI->seqCollector).maxSequences < uVar4 + 1) {
    __assert_fail("zc->seqCollector.maxSequences >= seqStoreSeqSize + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5db3,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  pZVar2 = (in_RDI->blockState).prevCBlock;
  local_54 = *(undefined8 *)pZVar2->rep;
  local_4c = pZVar2->rep[2];
  for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
    local_58 = psVar1[uVar6].offBase - 3;
    rep[uVar6].litLength = (uint)psVar1[uVar6].litLength;
    rep[uVar6].matchLength = psVar1[uVar6].mlBase + 3;
    rep[uVar6].rep = 0;
    if (uVar6 == psVar3->longLengthPos) {
      if (psVar3->longLengthType == ZSTD_llt_literalLength) {
        rep[uVar6].litLength = rep[uVar6].litLength + 0x10000;
      }
      else if (psVar3->longLengthType == ZSTD_llt_matchLength) {
        rep[uVar6].matchLength = rep[uVar6].matchLength + 0x10000;
      }
    }
    if (psVar1[uVar6].offBase < 4) {
      rep[uVar6].rep = psVar1[uVar6].offBase;
      if (rep[uVar6].litLength == 0) {
        if (rep[uVar6].rep == 3) {
          local_58 = (int)local_54 - 1;
        }
        else {
          local_58 = *(uint *)((long)&local_54 + (ulong)rep[uVar6].rep * 4);
        }
      }
      else {
        local_58 = *(uint *)((long)&local_54 + (ulong)(rep[uVar6].rep - 1) * 4);
      }
    }
    rep[uVar6].offset = local_58;
    ZSTD_updateRep(&rep->offset,(U32)(uVar6 >> 0x20),(U32)uVar6);
    local_30 = rep[uVar6].litLength + local_30;
  }
  if (uVar5 < local_30) {
    __assert_fail("seqStoreLiteralsSize >= literalsRead",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5ddc,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  rep[uVar6].litLength = (int)uVar5 - (int)local_30;
  rep[uVar6].rep = 0;
  rep[uVar6].offset = 0;
  rep[uVar6].matchLength = 0;
  (in_RDI->seqCollector).seqIndex = uVar4 + 1 + (in_RDI->seqCollector).seqIndex;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offBase - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offBase <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offBase;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        ZSTD_updateRep(updatedRepcodes.rep,
                       seqStoreSeqs[i].offBase,
                       seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}